

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Normal3f *n;
  Vector3<float> *v;
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ShapeSample *pSVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  Float FVar21;
  type tVar22;
  float fVar23;
  float fVar56;
  undefined8 uVar53;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar52;
  undefined1 in_register_00001208 [56];
  undefined1 auVar30 [64];
  undefined1 auVar54 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar24 [16];
  undefined1 extraout_var_04 [56];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var_03 [60];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar55 [56];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float s;
  float fVar60;
  Point3f PVar61;
  Point3f PVar62;
  array<float,_3> aVar63;
  Vector3<float> VVar64;
  Normal3<float> NVar65;
  Normal3<float> NVar66;
  Normal3<float> NVar67;
  span<const_float> w_00;
  span<const_float> w_01;
  initializer_list<float> v_00;
  initializer_list<pbrt::Point3<float>_> v_01;
  undefined1 local_1b8 [16];
  Point2f u_local;
  array<float,_4> w;
  float fStack_150;
  float fStack_14c;
  Tuple3<pbrt::Vector3,_float> local_148;
  undefined4 local_13c;
  Tuple3<pbrt::Point3,_float> local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  long local_f8;
  Float triPDF;
  optional<pbrt::ShapeSample> ss;
  Tuple3<pbrt::Point3,_float> local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_05 [56];
  
  auVar30._8_56_ = in_register_00001208;
  auVar30._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  u_local.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar30._0_16_);
  lVar2 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar16 = (long)this->triIndex;
  lVar3 = *(long *)(lVar2 + 8);
  lVar4 = *(long *)(lVar2 + 0x10);
  lVar17 = (long)*(int *)(lVar3 + lVar16 * 0xc) * 0xc;
  lVar18 = (long)*(int *)(lVar3 + 4 + lVar16 * 0xc) * 0xc;
  lVar19 = (long)*(int *)(lVar3 + 8 + lVar16 * 0xc) * 0xc;
  fVar23 = *(float *)(lVar4 + 8 + lVar18);
  uVar53 = *(undefined8 *)(lVar4 + lVar17);
  local_128 = (float)uVar53;
  fStack_124 = (float)((ulong)uVar53 >> 0x20);
  fStack_120 = 0.0;
  fStack_11c = 0.0;
  uVar53 = *(undefined8 *)(lVar4 + lVar18);
  local_108 = (float)uVar53;
  fStack_104 = (float)((ulong)uVar53 >> 0x20);
  uStack_100 = 0;
  local_1b8._0_8_ = *(ulong *)(lVar4 + lVar19);
  local_1b8._8_8_ = 0;
  fVar1 = *(float *)(lVar4 + 8 + lVar19);
  auVar54 = (undefined1  [56])0x0;
  local_118._0_4_ = *(float *)(lVar4 + 8 + lVar17);
  PVar61 = ShapeSampleContext::p(ctx);
  ss.optionalValue._8_4_ = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
  auVar31._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar54;
  ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar31._0_16_);
  FVar21 = SolidAngle(this,(Point3f *)&ss);
  if ((FVar21 < 0.0002) || (6.22 < FVar21)) {
    Sample(&ss,this,&u_local);
    FVar21 = ctx->time;
    pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
    auVar54 = (undefined1  [56])0x0;
    (pSVar15->intr).time = FVar21;
    pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
    PVar61 = Interaction::p(&pSVar15->intr);
    auVar33._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar33._8_56_ = auVar54;
    PVar62 = ShapeSampleContext::p(ctx);
    auVar34._0_8_ = PVar62.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar34._8_56_ = auVar54;
    auVar24 = vsubps_avx(auVar33._0_16_,auVar34._0_16_);
    w.values._0_8_ = vmovlps_avx(auVar24);
    w.values[2] = PVar61.super_Tuple3<pbrt::Point3,_float>.z -
                  PVar62.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar20._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar20._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar20._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar20 = vmovshdup_avx(auVar20);
    auVar20 = vfmadd231ss_fma(auVar20,auVar24,auVar24);
    auVar54 = ZEXT856(0);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)w.values[2]),ZEXT416((uint)w.values[2]));
    if ((auVar20._0_4_ != 0.0) || (NAN(auVar20._0_4_))) {
      VVar64 = Normalize<float>((Vector3<float> *)&w);
      w.values[2] = VVar64.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._0_8_ = VVar64.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar35._8_56_ = auVar54;
      w.values._0_8_ = vmovlps_avx(auVar35._0_16_);
      pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      auVar24._0_8_ = w.values._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = 0x80000000;
      auVar24._12_4_ = 0x80000000;
      local_148.z = -w.values[2];
      local_148._0_8_ = vmovlps_avx(auVar24);
      tVar22 = AbsDot<float>(&(pSVar15->intr).n,(Vector3<float> *)&local_148);
      auVar54 = extraout_var_04;
      PVar61 = ShapeSampleContext::p(ctx);
      local_138.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
      auVar36._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar36._8_56_ = auVar54;
      local_138._0_8_ = vmovlps_avx(auVar36._0_16_);
      pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      PVar61 = Interaction::p(&pSVar15->intr);
      local_88.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
      auVar37._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar37._8_56_ = auVar54;
      local_88._0_8_ = vmovlps_avx(auVar37._0_16_);
      fVar23 = DistanceSquared<float>((Point3<float> *)&local_138,(Point3<float> *)&local_88);
      pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      pSVar15->pdf = pSVar15->pdf / (tVar22 / fVar23);
      pSVar15 = pstd::optional<pbrt::ShapeSample>::value(&ss);
      if (ABS(pSVar15->pdf) != INFINITY) {
        pstd::optional<pbrt::ShapeSample>::optional(__return_storage_ptr__,&ss);
        goto LAB_0040aa64;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_0040aa64:
    pstd::optional<pbrt::ShapeSample>::~optional(&ss);
    return __return_storage_ptr__;
  }
  auVar54 = ZEXT456(0);
  local_f8 = lVar2;
  if ((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
      (fVar57 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar57 == 0.0)) && (!NAN(fVar57))) {
    fVar57 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    auVar54 = (undefined1  [56])0x0;
    if ((fVar57 == 0.0) && (!NAN(fVar57))) {
      auVar32 = ZEXT464(0x3f800000);
      goto LAB_0040ac12;
    }
  }
  n = &ctx->ns;
  PVar61 = ShapeSampleContext::p(ctx);
  fVar57 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
  auVar38._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar38._8_56_ = auVar54;
  auVar24 = auVar38._0_16_;
  auVar5._4_4_ = fStack_124;
  auVar5._0_4_ = local_128;
  auVar5._8_4_ = fStack_120;
  auVar5._12_4_ = fStack_11c;
  auVar20 = vsubps_avx(auVar5,auVar24);
  auVar54 = ZEXT856(auVar20._8_8_);
  w.values[2] = (float)local_118 - fVar57;
  w.values._0_8_ = vmovlps_avx(auVar20);
  VVar64 = Normalize<float>((Vector3<float> *)&w);
  ss.optionalValue._8_4_ = VVar64.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._0_8_ = VVar64.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar39._8_56_ = auVar54;
  v = (Vector3<float> *)((long)&ss.optionalValue + 0xc);
  ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar39._0_16_);
  auVar6._4_4_ = fStack_104;
  auVar6._0_4_ = local_108;
  auVar6._8_8_ = uStack_100;
  auVar20 = vsubps_avx(auVar6,auVar24);
  auVar54 = ZEXT856(auVar20._8_8_);
  local_148.z = fVar23 - fVar57;
  local_148._0_8_ = vmovlps_avx(auVar20);
  VVar64 = Normalize<float>((Vector3<float> *)&local_148);
  ss.optionalValue._20_4_ = VVar64.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._0_8_ = VVar64.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar40._8_56_ = auVar54;
  ss.optionalValue._12_8_ = vmovlps_avx(auVar40._0_16_);
  auVar20 = vsubps_avx(local_1b8,auVar24);
  auVar54 = ZEXT856(auVar20._8_8_);
  local_138.z = fVar1 - fVar57;
  local_138._0_8_ = vmovlps_avx(auVar20);
  VVar64 = Normalize<float>((Vector3<float> *)&local_138);
  ss.optionalValue._32_4_ = VVar64.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._0_8_ = VVar64.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar41._8_56_ = auVar54;
  ss.optionalValue._24_8_ = vmovlps_avx(auVar41._0_16_);
  auVar42._0_4_ = AbsDot<float>(n,v);
  auVar42._4_60_ = extraout_var;
  auVar20 = vmaxss_avx(auVar42._0_16_,ZEXT416(0x3c23d70a));
  local_148.x = auVar20._0_4_;
  auVar43._0_4_ = AbsDot<float>(n,v);
  auVar43._4_60_ = extraout_var_00;
  auVar20 = vmaxss_avx(auVar43._0_16_,ZEXT416(0x3c23d70a));
  local_148.y = auVar20._0_4_;
  auVar44._0_4_ = AbsDot<float>(n,(Vector3<float> *)&ss);
  auVar44._4_60_ = extraout_var_01;
  auVar20 = vmaxss_avx(auVar44._0_16_,ZEXT416(0x3c23d70a));
  local_148.z = auVar20._0_4_;
  auVar45._0_4_ = AbsDot<float>(n,(Vector3<float> *)((long)&ss.optionalValue + 0x18));
  auVar45._4_60_ = extraout_var_02;
  auVar20 = vmaxss_avx(auVar45._0_16_,ZEXT416(0x3c23d70a));
  local_13c = auVar20._0_4_;
  v_00._M_len = 4;
  v_00._M_array = &local_148.x;
  pstd::array<float,_4>::array(&w,v_00);
  w_00.n = 4;
  w_00.ptr = w.values;
  auVar46._0_8_ = SampleBilinear(u_local,w_00);
  auVar46._8_56_ = extraout_var_05;
  u_local.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar46._0_16_);
  w_01.n = 4;
  w_01.ptr = w.values;
  auVar32._0_4_ = BilinearPDF(auVar46._0_8_,w_01);
  auVar32._4_60_ = extraout_var_03;
LAB_0040ac12:
  auVar54 = auVar32._8_56_;
  auVar7._4_4_ = fStack_124;
  auVar7._0_4_ = local_128;
  auVar7._8_4_ = fStack_120;
  auVar7._12_4_ = fStack_11c;
  w.values._0_8_ = vmovlps_avx(auVar7);
  w.values[2] = (float)local_118;
  auVar11._4_4_ = fStack_104;
  auVar11._0_4_ = local_108;
  auVar11._8_8_ = uStack_100;
  unique0x00006b80 = vmovlps_avx(auVar11);
  vmovlps_avx(local_1b8);
  v_01._M_len = 3;
  v_01._M_array = (iterator)&w;
  pstd::array<pbrt::Point3<float>,_3>::array((array<pbrt::Point3<float>,_3> *)&ss,v_01);
  PVar61 = ShapeSampleContext::p(ctx);
  local_148.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
  auVar47._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar47._8_56_ = auVar54;
  local_148._0_8_ = vmovlps_avx(auVar47._0_16_);
  aVar63 = SampleSphericalTriangle
                     ((array<pbrt::Point3<float>,_3> *)&ss,(Point3f *)&local_148,&u_local,&triPDF);
  fVar57 = aVar63.values[2];
  auVar48._0_8_ = aVar63.values._0_8_;
  auVar48._8_56_ = auVar54;
  if ((triPDF != 0.0) || (NAN(triPDF))) {
    auVar10._4_4_ = fStack_124;
    auVar10._0_4_ = local_128;
    auVar10._8_4_ = fStack_120;
    auVar10._12_4_ = fStack_11c;
    auVar12._4_4_ = fStack_104;
    auVar12._0_4_ = local_108;
    auVar12._8_8_ = uStack_100;
    auVar20 = vmovshdup_avx(auVar48._0_16_);
    s = aVar63.values[0];
    fVar8 = auVar20._0_4_;
    local_68 = local_108 * fVar8;
    fStack_64 = fStack_104 * auVar20._4_4_;
    fVar52 = auVar20._8_4_;
    fStack_60 = (float)uStack_100 * fVar52;
    fVar56 = auVar20._12_4_;
    fStack_5c = (float)((ulong)uStack_100 >> 0x20) * fVar56;
    local_48 = ZEXT416((uint)((float)local_118 * s));
    local_78 = local_128 * s;
    fStack_74 = fStack_124 * s;
    fStack_70 = fStack_120 * s;
    fStack_6c = fStack_11c * s;
    local_58 = ZEXT416((uint)(fVar23 * fVar8));
    ss.optionalValue._8_4_ = fVar1 * fVar57 + (float)local_118 * s + fVar23 * fVar8;
    fVar60 = (float)((ulong)local_1b8._0_8_ >> 0x20);
    auVar58._0_4_ = (float)local_1b8._0_8_ * fVar57 + local_78 + local_68;
    auVar58._4_4_ = fVar60 * fVar57 + fStack_74 + fStack_64;
    auVar58._8_4_ = fVar57 * 0.0 + fStack_70 + fStack_60;
    auVar58._12_4_ = fVar57 * 0.0 + fStack_6c + fStack_5c;
    ss.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar58);
    auVar20 = vsubps_avx(auVar12,auVar10);
    local_138.z = fVar23 - (float)local_118;
    local_138._0_8_ = vmovlps_avx(auVar20);
    auVar20 = vsubps_avx(local_1b8,auVar10);
    auVar55 = ZEXT856(auVar20._8_8_);
    local_88.z = fVar1 - (float)local_118;
    local_88._0_8_ = vmovlps_avx(auVar20);
    VVar64 = Cross<float>((Vector3<float> *)&local_138,(Vector3<float> *)&local_88);
    local_148.z = VVar64.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar49._0_8_ = VVar64.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar49._8_56_ = auVar55;
    local_148._0_8_ = vmovlps_avx(auVar49._0_16_);
    NVar65 = Normalize<float>((Normal3<float> *)&local_148);
    lVar2 = local_f8;
    w.values[2] = NVar65.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar50._0_8_ = NVar65.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar50._8_56_ = auVar55;
    w.values._0_8_ = vmovlps_avx(auVar50._0_16_);
    if (*(long *)(local_f8 + 0x18) == 0) {
      if (*(char *)(local_f8 + 0x38) != *(char *)(local_f8 + 0x39)) {
        auVar26._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar26._8_4_ = auVar55._0_4_ ^ 0x80000000;
        auVar26._12_4_ = auVar55._4_4_ ^ 0x80000000;
        w.values._0_8_ = vmovlps_avx(auVar26);
        w.values[2] = -w.values[2];
      }
    }
    else {
      fStack_150 = auVar54._0_4_;
      fStack_14c = auVar54._4_4_;
      NVar65 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          (*(long *)(local_f8 + 0x18) + (long)*(int *)(lVar3 + lVar16 * 0xc) * 0xc),
                          s);
      local_118 = NVar65.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      local_108 = fStack_150;
      fStack_104 = fStack_14c;
      NVar66 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          ((long)*(int *)(lVar3 + 4 + lVar16 * 0xc) * 0xc + *(long *)(lVar2 + 0x18))
                          ,fVar8);
      local_128 = NVar66.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_124 = NVar66.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar53 = 0;
      local_118._0_4_ = fVar52;
      local_118._4_4_ = fVar56;
      NVar67 = Tuple3<pbrt::Normal3,float>::operator*
                         ((Tuple3<pbrt::Normal3,float> *)
                          ((long)*(int *)(lVar3 + 8 + lVar16 * 0xc) * 0xc + *(long *)(lVar2 + 0x18))
                          ,(1.0 - s) - fVar8);
      local_148.z = NVar67.super_Tuple3<pbrt::Normal3,_float>.z +
                    NVar66.super_Tuple3<pbrt::Normal3,_float>.z +
                    NVar65.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar25._0_4_ = local_128 + (float)local_118 + NVar67.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar25._4_4_ = fStack_124 + local_118._4_4_ + NVar67.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar25._8_4_ = fStack_120 + fStack_110 + (float)uVar53;
      auVar25._12_4_ = fStack_11c + fStack_10c + (float)((ulong)uVar53 >> 0x20);
      auVar54 = ZEXT856(auVar25._8_8_);
      local_148._0_8_ = vmovlps_avx(auVar25);
      NVar65 = FaceForward<float>((Normal3<float> *)&w,(Normal3<float> *)&local_148);
      w.values[2] = NVar65.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar51._0_8_ = NVar65.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar51._8_56_ = auVar54;
      w.values._0_8_ = vmovlps_avx(auVar51._0_16_);
    }
    auVar27._8_4_ = 0x7fffffff;
    auVar27._0_8_ = 0x7fffffff7fffffff;
    auVar27._12_4_ = 0x7fffffff;
    auVar13._4_4_ = fStack_74;
    auVar13._0_4_ = local_78;
    auVar13._8_4_ = fStack_70;
    auVar13._12_4_ = fStack_6c;
    auVar20 = vandps_avx(auVar27,auVar13);
    auVar14._4_4_ = fStack_64;
    auVar14._0_4_ = local_68;
    auVar14._8_4_ = fStack_60;
    auVar14._12_4_ = fStack_5c;
    auVar24 = vandps_avx(auVar27,auVar14);
    auVar5 = vandps_avx(auVar27,local_48);
    auVar6 = vandps_avx(auVar27,local_58);
    fVar8 = (1.0 - s) - fVar8;
    auVar59._0_4_ = fVar8 * (float)local_1b8._0_8_;
    auVar59._4_4_ = fVar8 * fVar60;
    auVar59._8_4_ = fVar8 * 0.0;
    auVar59._12_4_ = fVar8 * 0.0;
    auVar7 = vandps_avx(ZEXT416((uint)(fVar8 * fVar1)),auVar27);
    local_148.z = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_) * 3.57628e-07;
    auVar5 = vandps_avx(auVar59,auVar27);
    auVar28._0_4_ = auVar20._0_4_ + auVar24._0_4_ + auVar5._0_4_;
    auVar28._4_4_ = auVar20._4_4_ + auVar24._4_4_ + auVar5._4_4_;
    auVar28._8_4_ = auVar20._8_4_ + auVar24._8_4_ + auVar5._8_4_;
    auVar28._12_4_ = auVar20._12_4_ + auVar24._12_4_ + auVar5._12_4_;
    auVar9._8_4_ = 0x34c00005;
    auVar9._0_8_ = 0x34c0000534c00005;
    auVar9._12_4_ = 0x34c00005;
    auVar20 = vmulps_avx512vl(auVar28,auVar9);
    local_148._0_8_ = vmovlps_avx(auVar20);
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&ss,(Vector3f *)&local_148);
    FVar21 = ctx->time;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = w.values[2];
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = w.values._0_8_;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar21;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
    auVar29._0_12_ = ZEXT812(0);
    auVar29._12_4_ = 0;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar29;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = triPDF * auVar32._0_4_;
  }
  else {
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x20) =
         ZEXT1264(ZEXT812(0));
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = ZEXT1264(ZEXT812(0));
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf *= BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }